

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O0

void __thiscall VGMPlayer::Cmd_PcmRamWrite(VGMPlayer *this)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  UINT8 *ROMData;
  UINT32 local_28;
  UINT32 dataLen;
  UINT32 wrtAddr;
  UINT32 dbPos;
  CHIP_DEVICE *cDev;
  UINT8 chipID;
  UINT8 chipType;
  VGMPlayer *pVStack_10;
  UINT8 dbType;
  VGMPlayer *this_local;
  
  cDev._7_1_ = this->_fileData[(ulong)this->_filePos + 2] & 0x7f;
  if (cDev._7_1_ < 0x40) {
    cDev._6_1_ = _VGM_BANK_CHIPS[cDev._7_1_];
    cDev._5_1_ = (UINT8)((int)(this->_fileData[(ulong)this->_filePos + 2] & 0x80) >> 7);
    pVStack_10 = this;
    _wrtAddr = GetDevicePtr(this,cDev._6_1_,cDev._5_1_);
    if ((_wrtAddr != (CHIP_DEVICE *)0x0) && (_wrtAddr->romWrite != (DEVFUNC_WRITE_BLOCK)0x0)) {
      dataLen = ReadLE24(this->_fileData + (ulong)this->_filePos + 3);
      local_28 = ReadLE24(this->_fileData + (ulong)this->_filePos + 6);
      ROMData._4_4_ = ReadLE24(this->_fileData + (ulong)this->_filePos + 9);
      uVar1 = (ulong)dataLen;
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&this->_pcmBank[cDev._7_1_].data);
      if (uVar1 < sVar2) {
        pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->_pcmBank[cDev._7_1_].data,(ulong)dataLen);
        if (ROMData._4_4_ == 0) {
          ROMData._4_4_ = 0x1000000;
        }
        DoRAMOfsPatches(this,cDev._6_1_,cDev._5_1_,&local_28,(UINT32 *)((long)&ROMData + 4));
        (*_wrtAddr->romWrite)((_wrtAddr->base).defInf.dataPtr,local_28,ROMData._4_4_,pvVar3);
      }
    }
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_PcmRamWrite(void)
{
	UINT8 dbType = fData[0x02] & 0x7F;
	if (dbType >= _PCM_BANK_COUNT)
		return;
	
	UINT8 chipType = _VGM_BANK_CHIPS[dbType];
	UINT8 chipID = (fData[0x02] & 0x80) >> 7;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->romWrite == NULL)
		return;
	
	UINT32 dbPos = ReadLE24(&fData[0x03]);
	UINT32 wrtAddr = ReadLE24(&fData[0x06]);
	UINT32 dataLen = ReadLE24(&fData[0x09]);
	if (dbPos >= _pcmBank[dbType].data.size())
		return;
	const UINT8* ROMData = &_pcmBank[dbType].data[dbPos];
	if (! dataLen)
		dataLen += 0x01000000;
	
	if (chipType == 0x14)	// NES APU
	{
		//Last95Drum = dbPos / dataLen - 1;
		//Last95Max = _pcmBank[dbType].data.size() / dataLen;
	}
	
	DoRAMOfsPatches(chipType, chipID, wrtAddr, dataLen);
	cDev->romWrite(cDev->base.defInf.dataPtr, wrtAddr, dataLen, ROMData);
	
	return;
}